

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O2

void __thiscall Assimp::Ogre::VertexDataXml::VertexDataXml(VertexDataXml *this)

{
  IVertexData::IVertexData(&this->super_IVertexData);
  (this->uvs).
  super__Vector_base<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->uvs).
  super__Vector_base<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->tangents).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->uvs).
  super__Vector_base<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tangents).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tangents).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->normals).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->normals).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->positions).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->normals).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->positions).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->positions).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

VertexDataXml::VertexDataXml()
{
}